

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O3

void Curl_pgrsStartNow(Curl_easy *data)

{
  int *piVar1;
  curltime now;
  
  (data->progress).speeder_c = 0;
  now = Curl_now();
  (data->progress).start.tv_sec = now.tv_sec;
  (data->progress).start.tv_usec = now.tv_usec;
  (data->progress).is_t_startransfer_set = false;
  (data->progress).ul_limit_start.tv_sec = 0;
  (data->progress).ul_limit_start.tv_usec = 0;
  (data->progress).dl_limit_start.tv_sec = 0;
  (data->progress).dl_limit_start.tv_usec = 0;
  piVar1 = &(data->progress).flags;
  *piVar1 = *piVar1 & 0x90;
  Curl_ratelimit(data,now);
  return;
}

Assistant:

void Curl_pgrsStartNow(struct Curl_easy *data)
{
  data->progress.speeder_c = 0; /* reset the progress meter display */
  data->progress.start = Curl_now();
  data->progress.is_t_startransfer_set = false;
  data->progress.ul_limit_start.tv_sec = 0;
  data->progress.ul_limit_start.tv_usec = 0;
  data->progress.dl_limit_start.tv_sec = 0;
  data->progress.dl_limit_start.tv_usec = 0;
  /* clear all bits except HIDE and HEADERS_OUT */
  data->progress.flags &= PGRS_HIDE|PGRS_HEADERS_OUT;
  Curl_ratelimit(data, data->progress.start);
}